

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::copyFrom(UnicodeSet *this,UnicodeSet *o,UBool asThawed)

{
  UBool UVar1;
  BMPSet *this_00;
  UnicodeSetStringSpan *this_01;
  UChar32 *__src;
  UVector *other;
  UnicodeSetStringSpan *local_b8;
  BMPSet *local_a8;
  UnicodeString local_98;
  undefined1 local_51;
  UnicodeSetStringSpan *local_50;
  undefined1 local_31;
  BMPSet *local_30;
  UErrorCode local_28;
  UBool local_21;
  UErrorCode ec;
  UBool asThawed_local;
  UnicodeSet *o_local;
  UnicodeSet *this_local;
  
  if ((this != o) &&
     (local_21 = asThawed, _ec = o, o_local = this, UVar1 = isFrozen(this), UVar1 == '\0')) {
    UVar1 = isBogus(_ec);
    if (UVar1 == '\0') {
      local_28 = U_ZERO_ERROR;
      ensureCapacity(this,_ec->len,&local_28);
      UVar1 = ::U_FAILURE(local_28);
      if (UVar1 == '\0') {
        this->len = _ec->len;
        __src = _ec->list;
        memcpy(this->list,__src,(long)this->len << 2);
        if ((_ec->bmpSet == (BMPSet *)0x0) || (local_21 != '\0')) {
          this->bmpSet = (BMPSet *)0x0;
        }
        else {
          this_00 = (BMPSet *)UMemory::operator_new((UMemory *)0x368,(size_t)__src);
          local_31 = 0;
          local_a8 = (BMPSet *)0x0;
          if (this_00 != (BMPSet *)0x0) {
            local_31 = 1;
            local_30 = this_00;
            BMPSet::BMPSet(this_00,_ec->bmpSet,this->list,this->len);
            local_a8 = this_00;
          }
          this->bmpSet = local_a8;
          if (this->bmpSet == (BMPSet *)0x0) {
            setToBogus(this);
            return this;
          }
        }
        if ((this->strings == (UVector *)0x0) || (_ec->strings == (UVector *)0x0)) {
          setToBogus(this);
        }
        else {
          other = _ec->strings;
          UVector::assign(this->strings,other,cloneUnicodeString,&local_28);
          if ((_ec->stringSpan == (UnicodeSetStringSpan *)0x0) || (local_21 != '\0')) {
            this->stringSpan = (UnicodeSetStringSpan *)0x0;
          }
          else {
            this_01 = (UnicodeSetStringSpan *)UMemory::operator_new((UMemory *)0x118,(size_t)other);
            local_51 = 0;
            local_b8 = (UnicodeSetStringSpan *)0x0;
            if (this_01 != (UnicodeSetStringSpan *)0x0) {
              local_51 = 1;
              local_50 = this_01;
              UnicodeSetStringSpan::UnicodeSetStringSpan(this_01,_ec->stringSpan,this->strings);
              local_b8 = this_01;
            }
            this->stringSpan = local_b8;
            if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
              setToBogus(this);
              return this;
            }
          }
          releasePattern(this);
          if (_ec->pat != (char16_t *)0x0) {
            UnicodeString::UnicodeString(&local_98,_ec->pat,_ec->patLen);
            setPattern(this,&local_98);
            UnicodeString::~UnicodeString(&local_98);
          }
        }
      }
    }
    else {
      setToBogus(this);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::copyFrom(const UnicodeSet& o, UBool asThawed) {
    if (this == &o) {
        return *this;
    }
    if (isFrozen()) {
        return *this;
    }
    if (o.isBogus()) {
        setToBogus();
        return *this;
    }
    UErrorCode ec = U_ZERO_ERROR;
    ensureCapacity(o.len, ec);
    if (U_FAILURE(ec)) {
        // ensureCapacity will mark the UnicodeSet as Bogus if OOM failure happens.
        return *this;
    }
    len = o.len;
    uprv_memcpy(list, o.list, (size_t)len*sizeof(UChar32));
    if (o.bmpSet == NULL || asThawed) {
        bmpSet = NULL;
    } else {
        bmpSet = new BMPSet(*o.bmpSet, list, len);
        if (bmpSet == NULL) { // Check for memory allocation error.
            setToBogus();
            return *this;
        }
    }
    if (strings != NULL && o.strings != NULL) {
        strings->assign(*o.strings, cloneUnicodeString, ec);
    } else { // Invalid strings.
        setToBogus();
        return *this;
    }
    if (o.stringSpan == NULL || asThawed) {
        stringSpan = NULL;
    } else {
        stringSpan = new UnicodeSetStringSpan(*o.stringSpan, *strings);
        if (stringSpan == NULL) { // Check for memory allocation error.
            setToBogus();
            return *this;
        }
    }
    releasePattern();
    if (o.pat) {
        setPattern(UnicodeString(o.pat, o.patLen));
    }
    return *this;
}